

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
Scope::Scope(Scope *this,bool outerScopeCrossesFunctionBarrier,shared_ptr<Scope> *outerScope)

{
  std::__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2> *)this,
             &outerScope->super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>);
  (this->localScope)._M_h._M_buckets = &(this->localScope)._M_h._M_single_bucket;
  (this->localScope)._M_h._M_bucket_count = 1;
  (this->localScope)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->localScope)._M_h._M_element_count = 0;
  (this->localScope)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->localScope)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->localScope)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->outerScopeCrossesFunctionBarrier = outerScopeCrossesFunctionBarrier;
  return;
}

Assistant:

explicit Scope(bool outerScopeCrossesFunctionBarrier, std::shared_ptr<Scope> outerScope) noexcept
  : outerScope{outerScope}
  , outerScopeCrossesFunctionBarrier{outerScopeCrossesFunctionBarrier}
  {}